

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nlsol_ex_easy_api.cc
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  string stub;
  string sopts;
  string solver;
  allocator<char> local_d9;
  allocator<char> local_d8 [32];
  allocator<char> local_b8 [32];
  string local_98;
  string local_78;
  string local_58;
  string local_38 [32];
  
  if (1 < argc) {
    std::__cxx11::string::string<std::allocator<char>>(local_38,argv[1],local_b8);
    if (argc == 2) {
      pcVar3 = "";
    }
    else {
      pcVar3 = argv[2];
    }
    std::__cxx11::string::string<std::allocator<char>>((string *)local_b8,pcVar3,local_d8);
    if ((uint)argc < 4) {
      pcVar3 = "";
      bVar1 = true;
    }
    else {
      iVar2 = strcmp("text",argv[3]);
      bVar1 = iVar2 != 0;
      if (argc == 4) {
        pcVar3 = "";
      }
      else {
        pcVar3 = argv[4];
      }
    }
    std::__cxx11::string::string<std::allocator<char>>((string *)local_d8,pcVar3,&local_d9);
    std::__cxx11::string::string((string *)&local_58,local_38);
    std::__cxx11::string::string((string *)&local_78,(string *)local_b8);
    std::__cxx11::string::string((string *)&local_98,(string *)local_d8);
    bVar1 = SolveAndCheck(&local_58,&local_78,bVar1,&local_98);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)local_d8);
    std::__cxx11::string::~string((string *)local_b8);
    std::__cxx11::string::~string(local_38);
    return (uint)!bVar1;
  }
  puts(
      "AMPL NL writer example.\nUsage:\n  <this_exe> <solver> [\"<solver_options>\" [binary/text [<stub>]]],\n\nwhere <solver> is ipopt, gurobi, minos, ...;\nbinary/text is the NL format (default: binary.)\nExamples:\n  <this_exe> ipopt \"\" text /tmp/stub\n  <this_exe> gurobi \"nonconvex=2 funcpieces=-2 funcpieceratio=1e-4\""
      );
  exit(0);
}

Assistant:

int main(int argc, const char* const* argv) {
  if (argc<2) {
    printf("%s\n",
           "AMPL NL writer example.\n"
           "Usage:\n"
           "  <this_exe> <solver> [\"<solver_options>\" [binary/text [<stub>]]],\n\n"
           "where <solver> is ipopt, gurobi, minos, ...;\n"
           "binary/text is the NL format (default: binary.)\n"
           "Examples:\n"
           "  <this_exe> ipopt \"\" text /tmp/stub\n"
           "  <this_exe> gurobi \"nonconvex=2 funcpieces=-2 funcpieceratio=1e-4\"");
    exit(0);
  }
  std::string solver = (argc>1) ? argv[1] : "minos";
  std::string sopts = (argc>2) ? argv[2] : "";
  bool binary = (argc<=3) || std::strcmp("text", argv[3]);
  std::string stub = (argc>4) ? argv[4] : "";

  if (!SolveAndCheck(solver, sopts, binary, stub))
    return EXIT_FAILURE;
  return EXIT_SUCCESS;
}